

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O3

EGLContext __thiscall
deqp::egl::GLES2SharingTest::createContext
          (GLES2SharingTest *this,EGLDisplay display,EGLContext share,EGLConfig config)

{
  deUint32 dVar1;
  int iVar2;
  Library *pLVar3;
  undefined4 extraout_var;
  TestError *this_00;
  EGLint attriblist [3];
  undefined8 local_40;
  undefined4 local_38;
  
  pLVar3 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_40 = 0x200003098;
  local_38 = 0x3038;
  (**pLVar3->_vptr_Library)(pLVar3,0x30a0);
  dVar1 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
  eglu::checkError(dVar1,"bindAPI(EGL_OPENGL_ES_API)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                   ,0x8a);
  iVar2 = (*pLVar3->_vptr_Library[6])(pLVar3,display,config,share,&local_40);
  dVar1 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
  eglu::checkError(dVar1,"Failed to create GLES2 context",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                   ,0x8d);
  if ((EGLContext)CONCAT44(extraout_var,iVar2) != (EGLContext)0x0) {
    return (EGLContext)CONCAT44(extraout_var,iVar2);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"context != EGL_NO_CONTEXT",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
             ,0x8e);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

EGLContext GLES2SharingTest::createContext (EGLDisplay display, EGLContext share, EGLConfig config)
{
	const Library& egl = m_eglTestCtx.getLibrary();
	EGLContext context = EGL_NO_CONTEXT;
	const EGLint attriblist[] =
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};

	EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));

	context = egl.createContext(display, config, share, attriblist);
	EGLU_CHECK_MSG(egl, "Failed to create GLES2 context");
	TCU_CHECK(context != EGL_NO_CONTEXT);

	return context;
}